

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.hpp
# Opt level: O0

lane<std::complex<float>_> *
re::simd::lane_transform<std::complex<float>,re::simd::intrinsics::mul<std::complex<float>>>
          (undefined8 param_1,undefined8 param_2,lane<std::complex<float>_> *param_3)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  iterator pvVar4;
  
  pvVar1 = std::cbegin<std::array<std::complex<float>,1ul>>
                     ((array<std::complex<float>,_1UL> *)0x10e10d);
  pvVar2 = std::cend<std::array<std::complex<float>,1ul>>
                     ((array<std::complex<float>,_1UL> *)0x10e11c);
  pvVar3 = std::cbegin<std::array<std::complex<float>,1ul>>
                     ((array<std::complex<float>,_1UL> *)0x10e12b);
  pvVar4 = std::begin<std::array<std::complex<float>,1ul>>
                     ((array<std::complex<float>,_1UL> *)0x10e13a);
  std::
  transform<std::complex<float>const*,std::complex<float>const*,std::complex<float>*,re::simd::intrinsics::mul<std::complex<float>>>
            (pvVar1,pvVar2,pvVar3,pvVar4);
  return param_3;
}

Assistant:

lane<T>& lane_transform(
    lane<T> const& a,
    lane<T> const& b,
    lane<T>& output,
    BinaryOp op
) {
    std::transform(
        std::cbegin(a.a),
        std::cend(a.a),
        std::cbegin(b.a),
        std::begin(output.a),
        op
    );
    return output;
}